

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRProjectionNode::render
          (VRProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRAnyCoreType t;
  allocator<char> local_1e9;
  VRMatrix4 cameraMat;
  VRMatrix4 viewMat;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  VRDataIndex::pushState(renderState);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionMatrix",(allocator<char> *)&viewMat);
  VRDataIndex::addData
            (&local_38,renderState,(string *)&cameraMat,
             &(this->_projectionMatrix).super_VRFloatArrayConvertible);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionHorizontalClip",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_58,renderState,(string *)&cameraMat,this->_horizontalClip);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectoinVerticalClip",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_78,renderState,(string *)&cameraMat,this->_verticalClip);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionFovX",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_98,renderState,(string *)&cameraMat,this->_fovX);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionFovY",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_b8,renderState,(string *)&cameraMat,this->_fovY);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionNearClip",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_d8,renderState,(string *)&cameraMat,this->_nearClip);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMat,"ProjectionFarClip",(allocator<char> *)&viewMat);
  VRDataIndex::addData(&local_f8,renderState,(string *)&cameraMat,this->_farClip);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&viewMat,"CameraMatrix",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_1e9);
  t = VRDataIndex::getValue(renderState,(string *)&viewMat,&local_138,true);
  VRMatrix4::VRMatrix4(&cameraMat,t);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&viewMat);
  VRMatrix4::inverse(&viewMat,&cameraMat);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ViewMatrix",&local_1e9);
  VRDataIndex::addData(&local_118,renderState,&local_158,&viewMat.super_VRFloatArrayConvertible);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_158);
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  VRMatrix4::~VRMatrix4(&viewMat);
  VRMatrix4::~VRMatrix4(&cameraMat);
  return;
}

Assistant:

void VRProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
  renderState->pushState();

  renderState->addData("ProjectionMatrix", _projectionMatrix);
  renderState->addData("ProjectionHorizontalClip", _horizontalClip);
  renderState->addData("ProjectoinVerticalClip", _verticalClip);
  renderState->addData("ProjectionFovX", _fovX);
  renderState->addData("ProjectionFovY", _fovY);
  renderState->addData("ProjectionNearClip", _nearClip);
  renderState->addData("ProjectionFarClip", _farClip);

  VRMatrix4 cameraMat = renderState->getValue("CameraMatrix");

  VRMatrix4 viewMat = cameraMat.inverse();

  renderState->addData("ViewMatrix", viewMat);

  VRDisplayNode::render(renderState, renderHandler);

  renderState->popState();

}